

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O2

MatrixXd * __thiscall
Tools::CalculateJacobian(MatrixXd *__return_storage_ptr__,Tools *this,VectorXd *x_state)

{
  double dVar1;
  double dVar2;
  double dVar3;
  CoeffReturnType pdVar4;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar5;
  invalid_argument *this_00;
  float fVar6;
  float fVar7;
  double dVar8;
  float fVar9;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  Scalar local_68;
  Scalar local_60;
  double local_58;
  double local_50;
  Scalar local_48;
  Scalar local_40;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_38;
  
  local_38.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)CONCAT44(local_38.m_xpr._4_4_,3);
  local_90 = (double)CONCAT44(local_90._4_4_,4);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,(int *)&local_38,
             (int *)&local_90);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_state,0);
  fVar6 = (float)*pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_state,1);
  fVar7 = (float)*pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_state,2);
  dVar1 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_state,3);
  if (((fVar6 != 0.0) || (NAN(fVar6))) && ((fVar7 != 0.0 || (NAN(fVar7))))) {
    dVar2 = *pdVar4;
    fVar9 = fVar7 * fVar7 + fVar6 * fVar6;
    dVar8 = (double)(fVar6 / SQRT(fVar9));
    local_38.m_row = 0;
    local_38.m_col = 1;
    local_38.m_currentBlockRows = 1;
    *(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
     m_storage.m_data = dVar8;
    dVar3 = (double)(fVar7 / SQRT(fVar9));
    local_90 = dVar3;
    local_38.m_xpr = __return_storage_ptr__;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_38,&local_90);
    local_40 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_40);
    local_48 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_48);
    local_50 = (double)(-fVar7 / fVar9);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_50);
    local_58 = (double)(fVar6 / fVar9);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_58);
    local_60 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_60);
    local_68 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_68);
    fVar9 = ((float)dVar1 * fVar7 - (float)dVar2 * fVar6) / fVar9;
    local_70 = (double)(fVar7 * fVar9);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_70);
    local_78 = (double)(fVar9 * fVar6);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_78);
    local_80 = dVar8;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_80);
    local_88 = dVar3;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar5,&local_88);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_38)
    ;
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Division by zero error calculation jacobian");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

MatrixXd Tools::CalculateJacobian(const VectorXd& x_state) {
    MatrixXd Hj(3,4);
    //recover state parameters
    float px = x_state(0);
    float py = x_state(1);
    float vx = x_state(2);
    float vy = x_state(3);

    //check division by zero
    if(px == 0 || py == 0) {
        throw std::invalid_argument("Division by zero error calculation jacobian");
    }

    //compute the Jacobian matrix
    float px2 = px * px;
    float py2 = py * py;
    float px2Ppy2 = px2 + py2;
    float px2Ppy2Sq = sqrt(px2Ppy2);
    float bigOne = (vx*py - vy*px)/(pow(px2Ppy2, 3/2));

    Hj << px/px2Ppy2Sq, py/px2Ppy2Sq, 0, 0,
            -py/px2Ppy2, px/px2Ppy2, 0, 0,
            py*bigOne, px*bigOne, px/px2Ppy2Sq, py/px2Ppy2Sq;

    return Hj;
}